

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS
ref_split_face(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  REF_CELL pRVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT nodes [27];
  REF_INT face_nodes [27];
  REF_INT local_138;
  REF_INT local_134;
  REF_INT local_130;
  REF_INT local_12c;
  REF_GRID local_128;
  int local_120;
  int local_11c;
  REF_INT local_118 [28];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  
  pRVar1 = ref_grid->cell[8];
  local_a8 = node0;
  local_a4 = node1;
  local_a0 = node2;
  local_9c = node0;
  uVar2 = ref_cell_with_face(pRVar1,&local_a8,&local_11c,&local_120);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1e4,
           "ref_split_face",(ulong)uVar2,"get tet(2)");
    return uVar2;
  }
  local_134 = node1;
  local_130 = node0;
  local_128 = ref_grid;
  if (local_11c != -1) {
    local_12c = local_11c;
    uVar2 = ref_cell_nodes(pRVar1,local_11c,local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1e7
             ,"ref_split_face",(ulong)uVar2,"cell nodes");
      return uVar2;
    }
    uVar2 = ref_cell_remove(pRVar1,local_12c);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1e8
             ,"ref_split_face",(ulong)uVar2,"remove");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == local_130) {
          local_118[lVar4] = new_node;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1ec
             ,"ref_split_face",(ulong)uVar2,"add node0 version");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == new_node) {
          local_118[lVar4] = local_130;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == local_134) {
          local_118[lVar4] = new_node;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1f2
             ,"ref_split_face",(ulong)uVar2,"add node1 version");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == new_node) {
          local_118[lVar4] = local_134;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == node2) {
          local_118[lVar4] = new_node;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1f8
             ,"ref_split_face",(ulong)uVar2,"add node2 version");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == new_node) {
          local_118[lVar4] = node2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
  }
  if (local_120 != -1) {
    local_12c = local_120;
    uVar2 = ref_cell_nodes(pRVar1,local_120,local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1fe
             ,"ref_split_face",(ulong)uVar2,"cell nodes");
      return uVar2;
    }
    uVar2 = ref_cell_remove(pRVar1,local_12c);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x1ff
             ,"ref_split_face",(ulong)uVar2,"remove");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == local_130) {
          local_118[lVar4] = new_node;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x203
             ,"ref_split_face",(ulong)uVar2,"add node0 version");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == new_node) {
          local_118[lVar4] = local_130;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == local_134) {
          local_118[lVar4] = new_node;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x209
             ,"ref_split_face",(ulong)uVar2,"add node1 version");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == new_node) {
          local_118[lVar4] = local_134;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == node2) {
          local_118[lVar4] = new_node;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
    uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x20f
             ,"ref_split_face",(ulong)uVar2,"add node2 version");
      return uVar2;
    }
    if (0 < pRVar1->node_per) {
      lVar4 = 0;
      do {
        if (local_118[lVar4] == new_node) {
          local_118[lVar4] = node2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pRVar1->node_per);
    }
  }
  pRVar1 = local_128->cell[3];
  uVar3 = ref_cell_with(pRVar1,&local_a8,&local_12c);
  uVar2 = 0;
  if ((uVar3 != 0) && (uVar3 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x215,
           "ref_split_face",(ulong)uVar3,"find tri");
    uVar2 = uVar3;
  }
  if ((uVar3 == 5) || (uVar3 == 0)) {
    if (local_12c == -1) {
      uVar2 = 0;
    }
    else {
      uVar2 = ref_cell_nodes(pRVar1,local_12c,local_118);
      if (uVar2 == 0) {
        uVar2 = ref_cell_remove(pRVar1,local_12c);
        if (uVar2 == 0) {
          if (0 < pRVar1->node_per) {
            lVar4 = 0;
            do {
              if (local_118[lVar4] == local_130) {
                local_118[lVar4] = new_node;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < pRVar1->node_per);
          }
          uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
          if (uVar2 == 0) {
            if (0 < pRVar1->node_per) {
              lVar4 = 0;
              do {
                if (local_118[lVar4] == new_node) {
                  local_118[lVar4] = local_130;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar1->node_per);
            }
            if (0 < pRVar1->node_per) {
              lVar4 = 0;
              do {
                if (local_118[lVar4] == local_134) {
                  local_118[lVar4] = new_node;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < pRVar1->node_per);
            }
            uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
            if (uVar2 == 0) {
              if (0 < pRVar1->node_per) {
                lVar4 = 0;
                do {
                  if (local_118[lVar4] == new_node) {
                    local_118[lVar4] = local_134;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < pRVar1->node_per);
              }
              if (0 < pRVar1->node_per) {
                lVar4 = 0;
                do {
                  if (local_118[lVar4] == node2) {
                    local_118[lVar4] = new_node;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < pRVar1->node_per);
              }
              uVar2 = ref_cell_add(pRVar1,local_118,&local_138);
              if (uVar2 == 0) {
                uVar2 = 0;
                if (0 < pRVar1->node_per) {
                  lVar4 = 0;
                  do {
                    if (local_118[lVar4] == new_node) {
                      local_118[lVar4] = node2;
                    }
                    lVar4 = lVar4 + 1;
                  } while (lVar4 < pRVar1->node_per);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x228,"ref_split_face",(ulong)uVar2,"add node2 version");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x222,"ref_split_face",(ulong)uVar2,"add node1 version");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x21c,"ref_split_face",(ulong)uVar2,"add node0 version");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x218,"ref_split_face",(ulong)uVar2,"remove");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x217,"ref_split_face",(ulong)uVar2,"cell nodes");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_split_face(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT node2,
                                  REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell0, cell1;
  REF_INT node, new_cell;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "get tet(2)");
  if (REF_EMPTY != cell0) {
    cell = cell0;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }
  if (REF_EMPTY != cell1) {
    cell = cell1;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  ref_cell = ref_grid_tri(ref_grid);
  RXS(ref_cell_with(ref_cell, face_nodes, &cell), REF_NOT_FOUND, "find tri");
  if (REF_EMPTY != cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  return REF_SUCCESS;
}